

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O0

ConstantMap * __thiscall OSTEI_VRR_Writer::GetConstants_abi_cxx11_(OSTEI_VRR_Writer *this)

{
  int iVar1;
  long in_RSI;
  ConstantMap *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar2;
  int i;
  ConstantMap *cm;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffff60;
  int iVar3;
  ConstantMap *this_00;
  string local_68 [24];
  int *in_stack_ffffffffffffffb0;
  char (*in_stack_ffffffffffffffb8) [7];
  int local_18;
  
  this_00 = in_RDI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x140fae);
  local_18 = 1;
  while (iVar3 = local_18,
        iVar1 = OSTEI_VRR_Algorithm_Base::GetMaxInt(*(OSTEI_VRR_Algorithm_Base **)(in_RSI + 8)),
        iVar3 <= iVar1) {
    StringBuilder<char[7],int&>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    StringBuilder<int>((int *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    pVar2 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::emplace<std::__cxx11::string,std::__cxx11::string>
                      (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(iVar1,iVar3),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff60._M_node);
    in_stack_ffffffffffffff60 = pVar2.first._M_node;
    in_stack_ffffffffffffff5f = pVar2.second;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    local_18 = local_18 + 1;
  }
  return in_RDI;
}

Assistant:

ConstantMap OSTEI_VRR_Writer::GetConstants(void) const
{
    ConstantMap cm;
    for(int i = 1; i <= vrr_algo_.GetMaxInt(); i++)
        cm.emplace(StringBuilder("const_", i), StringBuilder(i));
    return cm;
}